

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unzip.c
# Opt level: O2

int unz64local_getLong64(zlib_filefunc64_32_def *pzlib_filefunc_def,voidpf filestream,ZPOS64_T *pX)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  int i;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  i = 0;
  iVar1 = unz64local_getByte(pzlib_filefunc_def,filestream,&i);
  iVar2 = -1;
  if (iVar1 == 0) {
    uVar8 = (ulong)i;
    iVar1 = unz64local_getByte(pzlib_filefunc_def,filestream,&i);
    if (iVar1 == 0) {
      lVar9 = (long)i;
      iVar1 = unz64local_getByte(pzlib_filefunc_def,filestream,&i);
      if (iVar1 == 0) {
        lVar10 = (long)i;
        local_38 = lVar9;
        iVar1 = unz64local_getByte(pzlib_filefunc_def,filestream,&i);
        if (iVar1 == 0) {
          lVar9 = (long)i;
          local_40 = lVar10;
          iVar1 = unz64local_getByte(pzlib_filefunc_def,filestream,&i);
          if (iVar1 == 0) {
            lVar10 = (long)i;
            local_48 = lVar9;
            iVar1 = unz64local_getByte(pzlib_filefunc_def,filestream,&i);
            if (iVar1 == 0) {
              uVar11 = (ulong)(uint)i;
              local_50 = lVar10;
              iVar1 = unz64local_getByte(pzlib_filefunc_def,filestream,&i);
              if (iVar1 == 0) {
                uVar4 = (ulong)(uint)i;
                uVar6 = local_50 << 0x20;
                uVar7 = local_48 << 0x18;
                uVar5 = local_40 << 0x10;
                uVar12 = local_38 << 8;
                iVar2 = unz64local_getByte(pzlib_filefunc_def,filestream,&i);
                uVar3 = 0;
                if (iVar2 == 0) {
                  uVar3 = (ulong)(uint)i << 0x38 |
                          uVar12 | uVar8 | uVar5 | uVar7 | uVar6 | uVar11 << 0x28 | uVar4 << 0x30;
                }
                goto LAB_001a5ae3;
              }
            }
          }
        }
      }
    }
  }
  uVar3 = 0;
LAB_001a5ae3:
  *pX = uVar3;
  return iVar2;
}

Assistant:

local int unz64local_getLong64(const zlib_filefunc64_32_def* pzlib_filefunc_def,
    voidpf filestream,
    ZPOS64_T* pX)
{
    ZPOS64_T x;
    int i = 0;
    int err;

    err = unz64local_getByte(pzlib_filefunc_def, filestream, &i);
    x = (ZPOS64_T)i;

    if (err == UNZ_OK)
        err = unz64local_getByte(pzlib_filefunc_def, filestream, &i);
    x |= ((ZPOS64_T)i) << 8;

    if (err == UNZ_OK)
        err = unz64local_getByte(pzlib_filefunc_def, filestream, &i);
    x |= ((ZPOS64_T)i) << 16;

    if (err == UNZ_OK)
        err = unz64local_getByte(pzlib_filefunc_def, filestream, &i);
    x |= ((ZPOS64_T)i) << 24;

    if (err == UNZ_OK)
        err = unz64local_getByte(pzlib_filefunc_def, filestream, &i);
    x |= ((ZPOS64_T)i) << 32;

    if (err == UNZ_OK)
        err = unz64local_getByte(pzlib_filefunc_def, filestream, &i);
    x |= ((ZPOS64_T)i) << 40;

    if (err == UNZ_OK)
        err = unz64local_getByte(pzlib_filefunc_def, filestream, &i);
    x |= ((ZPOS64_T)i) << 48;

    if (err == UNZ_OK)
        err = unz64local_getByte(pzlib_filefunc_def, filestream, &i);
    x |= ((ZPOS64_T)i) << 56;

    if (err == UNZ_OK)
        *pX = x;
    else
        *pX = 0;
    return err;
}